

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O1

unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *
__thiscall
wallet::LegacyDataSPKM::GetNotMineScriptPubKeys
          (unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
           *__return_storage_ptr__,LegacyDataSPKM *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  __hashtable *__h;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock50;
  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
  *local_50;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  SaltedSipHasher::SaltedSipHasher((SaltedSipHasher *)__return_storage_ptr__);
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  p_Var3 = (this->setWatchOnly)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->setWatchOnly)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      iVar2 = (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[3])(this,p_Var3 + 1);
      if (iVar2 == 0) {
        local_50 = __return_storage_ptr__;
        std::
        _Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<CScript_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<CScript,true>>>>
                  ((_Hashtable<CScript,CScript,std::allocator<CScript>,std::__detail::_Identity,std::equal_to<CScript>,SaltedSipHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)__return_storage_ptr__,p_Var3 + 1,&local_50);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::unordered_set<CScript, SaltedSipHasher> LegacyDataSPKM::GetNotMineScriptPubKeys() const
{
    LOCK(cs_KeyStore);
    std::unordered_set<CScript, SaltedSipHasher> spks;
    for (const CScript& script : setWatchOnly) {
        if (IsMine(script) == ISMINE_NO) spks.insert(script);
    }
    return spks;
}